

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O0

DdNode * Cudd_bddXorExistAbstract(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  int iVar1;
  DdNode *res;
  DdNode *cube_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  iVar1 = bddCheckPositiveCube(manager,cube);
  if (iVar1 == 0) {
    fprintf((FILE *)manager->err,"Error: Can only abstract positive cubes\n");
    manager->errorCode = CUDD_INVALID_ARG;
    manager_local = (DdManager *)0x0;
  }
  else {
    do {
      manager->reordered = 0;
      manager_local = (DdManager *)cuddBddXorExistAbstractRecur(manager,f,g,cube);
    } while (manager->reordered == 1);
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddXorExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *res;

    if (bddCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,
                       "Error: Can only abstract positive cubes\n");
        manager->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddBddXorExistAbstractRecur(manager, f, g, cube);
    } while (manager->reordered == 1);

    return(res);

}